

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O0

error_code_t *
base64::detail::invalid_buffer_size_error<base64::url_encoding_t>
          (error_code_t *__return_storage_ptr__,size_t base64_buffer_size)

{
  char *pcVar1;
  const_pointer __format;
  allocator<char> local_89;
  string local_88;
  undefined1 auStack_68 [8];
  string_view msg_template;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string msg;
  size_t msg_buffer_size;
  size_t base64_buffer_size_local;
  
  msg.field_2._8_8_ = 0xff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,0x100,'\0',&local_41);
  std::allocator<char>::~allocator(&local_41);
  auStack_68 = (undefined1  [8])0x7b;
  msg_template._M_len = (size_t)anon_var_dwarf_42509;
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40)
  ;
  __format = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_68);
  snprintf(pcVar1,0xff,__format,base64_buffer_size);
  pcVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
  error_code_t::error_code_t(__return_storage_ptr__,invalid_buffer_size,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline error_code_t invalid_buffer_size_error(size_t base64_buffer_size)
    {
        constexpr size_t msg_buffer_size = 255;
        std::string msg(msg_buffer_size + 1, '\0');

        if constexpr (encoding_traits::has_pad())
        {
            constexpr std::string_view msg_template =
                "The base64 buffer has invalid size of %zu. "
                "The buffer size must be a multiple of 4.";

            std::snprintf(msg.data(), msg_buffer_size, msg_template.data(), base64_buffer_size);
        }
        else
        {
            constexpr std::string_view msg_template =
                "The base64 buffer has invalid size of %zu. "
                "The buffer size must be a multiple of 4 or have a remainder of division 2 and 3.";

            std::snprintf(msg.data(), msg_buffer_size, msg_template.data(), base64_buffer_size);
        }

        return error_code_t(error_type_t::invalid_buffer_size, msg.c_str());
    }